

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O3

void pack_free(t_pack *x)

{
  int iVar1;
  t_gpointer *gp;
  
  iVar1 = (int)x->x_nptr;
  if (iVar1 != 0) {
    gp = x->x_gpointer;
    do {
      gpointer_unset(gp);
      gp = gp + 1;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  freebytes(x->x_vec,x->x_n << 4);
  freebytes(x->x_outvec,x->x_n << 4);
  freebytes(x->x_gpointer,x->x_nptr * 0x18);
  return;
}

Assistant:

static void pack_free(t_pack *x)
{
    t_gpointer *gp;
    int i;
    for (gp = x->x_gpointer, i = (int)x->x_nptr; i--; gp++)
        gpointer_unset(gp);
    freebytes(x->x_vec, x->x_n * sizeof(*x->x_vec));
    freebytes(x->x_outvec, x->x_n * sizeof(*x->x_outvec));
    freebytes(x->x_gpointer, x->x_nptr * sizeof(*x->x_gpointer));
}